

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

StringEnumeration * icu_63::TimeZoneNamesImpl::_getAvailableMetaZoneIDs(UErrorCode *status)

{
  UVector *pUVar1;
  StringEnumeration *this;
  size_t in_RSI;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar1 = ZoneMeta::getAvailableMetazoneIDs();
    this = (StringEnumeration *)UMemory::operator_new((UMemory *)0x90,in_RSI);
    if (pUVar1 == (UVector *)0x0) {
      if (this != (StringEnumeration *)0x0) {
        StringEnumeration::StringEnumeration(this);
        (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MetaZoneIDsEnumeration_003efcb0;
        *(undefined8 *)&this->field_0x74 = 0;
        this[1].unistr.super_Replaceable.super_UObject._vptr_UObject = (_func_int **)0x0;
        *(undefined8 *)&this[1].unistr.fUnion = 0;
        return this;
      }
    }
    else if (this != (StringEnumeration *)0x0) {
      StringEnumeration::StringEnumeration(this);
      (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MetaZoneIDsEnumeration_003efcb0;
      *(undefined4 *)&this[1].super_UObject._vptr_UObject = 0;
      this[1].unistr.super_Replaceable.super_UObject._vptr_UObject = (_func_int **)pUVar1;
      *(undefined8 *)&this[1].unistr.fUnion = 0;
      *(int32_t *)&this->field_0x74 = pUVar1->count;
      return this;
    }
  }
  return (StringEnumeration *)0x0;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }